

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows4_Test::
~SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows4_Test
          (SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows4_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows4_Test
            ((SemanticAnalyserTest_VariableDeclarationTypeMismatchThrows4_Test *)0x1e9218);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, VariableDeclarationTypeMismatchThrows4)
{
  std::string source = R"SRC(
  fn f(): f32
  {
    ret 12;
  }
  
  fn main(): f32
  {
    let x: function = f();
    ret 0;
  }
  )SRC";
  throwTest(source);
}